

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexMathFpu.cpp
# Opt level: O1

void Iex_3_2::setFpExceptions(int when)

{
  uint uVar1;
  uint uVar2;
  uint16_t cw;
  
  uVar2 = (uint)((when & 1U) == 0) * 8 + 0x37;
  uVar1 = uVar2 & 0xffffffef;
  if ((when & 2U) == 0) {
    uVar1 = uVar2;
  }
  uVar2 = uVar1 & 0xfffffffb;
  if ((when & 4U) == 0) {
    uVar2 = uVar1;
  }
  uVar1 = uVar2 & 0x1f;
  if ((when & 8U) == 0) {
    uVar1 = uVar2;
  }
  uVar2 = uVar1 & 0x3e;
  if ((when & 0x10U) == 0) {
    uVar2 = uVar1;
  }
  MXCSR = uVar2 << 7 | MXCSR & 0xffffe040;
  return;
}

Assistant:

void
setFpExceptions (int when)
{
    int mask = FpuControl::ALL_EXC;

    if (when & IEEE_OVERFLOW) mask &= ~FpuControl::OVERFLOW_EXC;
    if (when & IEEE_UNDERFLOW) mask &= ~FpuControl::UNDERFLOW_EXC;
    if (when & IEEE_DIVZERO) mask &= ~FpuControl::DIVZERO_EXC;
    if (when & IEEE_INEXACT) mask &= ~FpuControl::INEXACT_EXC;
    if (when & IEEE_INVALID) mask &= ~FpuControl::INVALID_EXC;

    //
    // The Linux kernel apparently sometimes passes
    // incorrect si_info to signal handlers unless
    // the exception flags are cleared.
    //
    // XXX is this still true on 2.4+ kernels?
    //

    FpuControl::setExceptionMask (mask);
    FpuControl::clearExceptions ();
}